

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_avg_8x8_quad_sse2(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  undefined1 (*pauVar1) [16];
  int k;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pauVar1 = (undefined1 (*) [16])(s + (long)(y16_idx * p) + (long)x16_idx);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    auVar3 = psadbw(*pauVar1,(undefined1  [16])0x0);
    auVar7 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p),(undefined1  [16])0x0);
    auVar4 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 2),(undefined1  [16])0x0);
    auVar10 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 3),(undefined1  [16])0x0);
    auVar5 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 4),(undefined1  [16])0x0);
    auVar8 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 5),(undefined1  [16])0x0);
    auVar6 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 6),(undefined1  [16])0x0);
    auVar9 = psadbw(*(undefined1 (*) [16])(*pauVar1 + p * 7),(undefined1  [16])0x0);
    avg[lVar2 * 2] =
         CONCAT22(auVar9._2_2_ +
                  auVar6._2_2_ + auVar8._2_2_ + auVar5._2_2_ +
                  auVar10._2_2_ + auVar4._2_2_ + auVar7._2_2_ + auVar3._2_2_,
                  auVar9._0_2_ +
                  auVar6._0_2_ + auVar8._0_2_ + auVar5._0_2_ +
                  auVar10._0_2_ + auVar4._0_2_ + auVar7._0_2_ + auVar3._0_2_) + 0x20U >> 6;
    avg[lVar2 * 2 + 1] =
         CONCAT22(auVar9._10_2_ +
                  auVar6._10_2_ + auVar8._10_2_ + auVar5._10_2_ +
                  auVar10._10_2_ + auVar4._10_2_ + auVar7._10_2_ + auVar3._10_2_,
                  auVar9._8_2_ +
                  auVar6._8_2_ + auVar8._8_2_ + auVar5._8_2_ +
                  auVar10._8_2_ + auVar4._8_2_ + auVar7._8_2_ + auVar3._8_2_) + 0x20U >> 6 & 0xffff;
    pauVar1 = (undefined1 (*) [16])(*pauVar1 + p * 8);
  }
  return;
}

Assistant:

void aom_avg_8x8_quad_sse2(const uint8_t *s, int p, int x16_idx, int y16_idx,
                           int *avg) {
  const uint8_t *s_ptr = s + y16_idx * p + x16_idx;
  for (int k = 0; k < 2; k++) {
    calc_avg_8x8_dual_sse2(s_ptr, p, avg + k * 2);
    s_ptr += 8 * p;
  }
}